

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

int Abc_NtkDontCareQuantify(Odc_Man_t *p)

{
  Odc_Lit_t OVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  
  if (p->iRoot == 0xffff) {
    __assert_fail("p->iRoot < 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x312,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
  }
  if (0x20 < p->vBranches->nSize) {
    __assert_fail("Vec_PtrSize(p->vBranches) <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x313,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
  }
  if (0 < p->vBranches->nSize) {
    iVar4 = 0;
    do {
      p->nTravIds = p->nTravIds + 1;
      uVar2 = Abc_NtkDontCareCofactors_rec(p,p->iRoot & 0xfffe,1 << ((byte)iVar4 & 0x1f));
      uVar3 = p->iRoot & 1;
      OVar1 = Odc_And(p,uVar3 ^ (ushort)uVar2 ^ 1,uVar3 ^ (ushort)(uVar2 >> 0x10) ^ 1);
      p->iRoot = OVar1 ^ 1;
      if (0x4000 < p->nObjs) {
        return 0;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->vBranches->nSize);
  }
  if (p->nObjs <= p->nObjsAlloc) {
    return 1;
  }
  __assert_fail("p->nObjs <= p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                ,0x321,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
}

Assistant:

int Abc_NtkDontCareQuantify( Odc_Man_t * p )
{   
    Odc_Lit_t uRes0, uRes1;
    unsigned uData;
    int i;
    assert( p->iRoot < 0xffff );
    assert( Vec_PtrSize(p->vBranches) <= 32 ); // the mask size
    for ( i = 0; i < Vec_PtrSize(p->vBranches); i++ )
    {
        // compute the cofactors w.r.t. this variable
        Odc_ManIncrementTravId( p );
        uData = Abc_NtkDontCareCofactors_rec( p, Odc_Regular(p->iRoot), (1 << i) );
        uRes0 = Odc_NotCond( (Odc_Lit_t)(uData & 0xffff), Odc_IsComplement(p->iRoot) );
        uRes1 = Odc_NotCond( (Odc_Lit_t)(uData >> 16),    Odc_IsComplement(p->iRoot) );
        // quantify this variable existentially
        p->iRoot = Odc_Or( p, uRes0, uRes1 );
        // check the limit
        if ( Odc_ObjNum(p) > ABC_DC_MAX_NODES/2 )
            return 0;
    }
    assert( p->nObjs <= p->nObjsAlloc );
    return 1;
}